

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Music_Emu.cpp
# Opt level: O1

void __thiscall Music_Emu::fill_buf(Music_Emu *this)

{
  short sVar1;
  short *psVar2;
  long lVar3;
  long lVar4;
  
  if (this->emu_track_ended_ == false) {
    emu_play(this,0x800,(this->buf).begin_);
    psVar2 = (this->buf).begin_;
    sVar1 = *psVar2;
    *psVar2 = 0x10;
    lVar4 = 0x1000;
    do {
      lVar3 = lVar4 + -2;
      lVar4 = lVar4 + -2;
    } while ((int)*(short *)((long)psVar2 + lVar3) + 8U < 0x11);
    *psVar2 = sVar1;
    if (0 < lVar4 >> 1) {
      this->silence_time = (lVar4 >> 1) + (long)this->emu_time + -0x800;
      this->buf_remain = 0x800;
      return;
    }
  }
  this->silence_count = this->silence_count + 0x800;
  return;
}

Assistant:

void Music_Emu::fill_buf()
{
	assert( !buf_remain );
	if ( !emu_track_ended_ )
	{
		emu_play( buf_size, buf.begin() );
		long silence = count_silence( buf.begin(), buf_size );
		if ( silence < buf_size )
		{
			silence_time = emu_time - silence;
			buf_remain   = buf_size;
			return;
		}
	}
	silence_count += buf_size;
}